

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::function_expression::~function_expression(function_expression *this)

{
  function_expression *this_local;
  
  ~function_expression(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit function_expression(const source_extend& extend, const source_extend& body_extend, const std::wstring& id, std::vector<std::wstring>&& params, statement_ptr&& block) : expression(extend), function_base(body_extend, id, std::move(params), std::move(block)) {
    }